

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::flattenTo
          (Delimited<kj::ArrayPtr<void_*const>_&> *this,char *target,char *limit)

{
  char *limit_00;
  char *target_00;
  void **extraout_RDX;
  void **value;
  void **extraout_RDX_00;
  void **extraout_RDX_01;
  CappedArray<char,_17UL> local_70;
  kj *local_50;
  void **elem;
  void **__end0;
  void **__begin0;
  ArrayPtr<void_*const> *__range3;
  char *pcStack_28;
  bool first;
  char *limit_local;
  char *target_local;
  Delimited<kj::ArrayPtr<void_*const>_&> *this_local;
  
  __range3._7_1_ = 1;
  __begin0 = &this->array->ptr;
  pcStack_28 = limit;
  limit_local = target;
  target_local = (char *)this;
  __end0 = ArrayPtr<void_*const>::begin((ArrayPtr<void_*const> *)__begin0);
  elem = ArrayPtr<void_*const>::end((ArrayPtr<void_*const> *)__begin0);
  value = extraout_RDX;
  while ((__end0 != elem && (local_50 = (kj *)__end0, limit_local != pcStack_28))) {
    if ((__range3._7_1_ & 1) == 0) {
      limit_local = fillLimited<kj::StringPtr>(limit_local,pcStack_28,&this->delimiter);
      value = extraout_RDX_00;
    }
    else {
      __range3._7_1_ = 0;
    }
    target_00 = limit_local;
    limit_00 = pcStack_28;
    toCharSequence<void*const&>(&local_70,local_50,value);
    limit_local = fillLimited<kj::CappedArray<char,17ul>>(target_00,limit_00,&local_70);
    __end0 = __end0 + 1;
    value = extraout_RDX_01;
  }
  return limit_local;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }